

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.h
# Opt level: O0

void __thiscall cmQtAutoGenInitializer::GenVarsT::GenVarsT(GenVarsT *this,GenT gen)

{
  string_view sVar1;
  GenT gen_local;
  GenVarsT *this_local;
  
  this->Enabled = false;
  this->Gen = gen;
  sVar1 = cmQtAutoGen::GeneratorNameUpper(gen);
  this->GenNameUpper = sVar1;
  std::__cxx11::string::string((string *)&this->ExecutableTargetName);
  this->ExecutableTarget = (cmGeneratorTarget *)0x0;
  cmQtAutoGen::ConfigString::ConfigString(&this->Executable);
  cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::ConfigStrings
            (&this->ExecutableFeatures);
  return;
}

Assistant:

GenVarsT(GenT gen)
      : Gen(gen)
      , GenNameUpper(cmQtAutoGen::GeneratorNameUpper(gen))
    {
    }